

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O0

FT_Error parse_fd_array(CID_Face face,CID_Parser *parser)

{
  FT_Realloc_Func p_Var1;
  CID_FaceDict dict;
  ulong uStack_40;
  FT_Int n;
  FT_Long num_dicts;
  FT_Stream pFStack_30;
  FT_Error error;
  FT_Stream stream;
  FT_Memory memory;
  CID_FaceInfo cid;
  CID_Parser *parser_local;
  CID_Face face_local;
  
  memory = (FT_Memory)&face->cid;
  stream = (FT_Stream)(face->root).memory;
  pFStack_30 = parser->stream;
  num_dicts._4_4_ = 0;
  cid = (CID_FaceInfo)parser;
  parser_local = (CID_Parser *)face;
  uStack_40 = (*(parser->root).funcs.to_int)(&parser->root);
  if ((long)uStack_40 < 0) {
    num_dicts._4_4_ = 3;
  }
  else {
    if (pFStack_30->size / 100 < uStack_40) {
      uStack_40 = pFStack_30->size / 100;
    }
    if (memory[9].realloc == (FT_Realloc_Func)0x0) {
      p_Var1 = (FT_Realloc_Func)
               ft_mem_realloc((FT_Memory)stream,0x150,0,uStack_40,(void *)0x0,
                              (FT_Error *)((long)&num_dicts + 4));
      memory[9].realloc = p_Var1;
      if (num_dicts._4_4_ == 0) {
        *(int *)&memory[9].free = (int)uStack_40;
        for (dict._4_4_ = 0; dict._4_4_ < *(int *)&memory[9].free; dict._4_4_ = dict._4_4_ + 1) {
          *(undefined4 *)(memory[9].realloc + (long)dict._4_4_ * 0x150 + 4) = 4;
        }
      }
    }
  }
  return num_dicts._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  parse_fd_array( CID_Face     face,
                  CID_Parser*  parser )
  {
    CID_FaceInfo  cid    = &face->cid;
    FT_Memory     memory = face->root.memory;
    FT_Stream     stream = parser->stream;
    FT_Error      error  = FT_Err_Ok;
    FT_Long       num_dicts;


    num_dicts = cid_parser_to_int( parser );
    if ( num_dicts < 0 )
    {
      FT_ERROR(( "parse_fd_array: invalid number of dictionaries\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /*
     * A single entry in the FDArray must (at least) contain the following
     * structure elements.
     *
     *   %ADOBeginFontDict              18
     *   X dict begin                   13
     *     /FontMatrix [X X X X]        22
     *     /Private X dict begin        22
     *     end                           4
     *   end                             4
     *   %ADOEndFontDict                16
     *
     * This needs 18+13+22+22+4+4+16=99 bytes or more.  Normally, you also
     * need a `dup X' at the very beginning and a `put' at the end, so a
     * rough guess using 100 bytes as the minimum is justified.
     */
    if ( (FT_ULong)num_dicts > stream->size / 100 )
    {
      FT_TRACE0(( "parse_fd_array: adjusting FDArray size"
                  " (from %d to %d)\n",
                  num_dicts,
                  stream->size / 100 ));
      num_dicts = (FT_Long)( stream->size / 100 );
    }

    if ( !cid->font_dicts )
    {
      FT_Int  n;


      if ( FT_NEW_ARRAY( cid->font_dicts, num_dicts ) )
        goto Exit;

      cid->num_dicts = num_dicts;

      /* don't forget to set a few defaults */
      for ( n = 0; n < cid->num_dicts; n++ )
      {
        CID_FaceDict  dict = cid->font_dicts + n;


        /* default value for lenIV */
        dict->private_dict.lenIV = 4;
      }
    }

  Exit:
    return error;
  }